

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orderedCollection.c
# Opt level: O0

void sysbvm_orderedCollection_atPut
               (sysbvm_tuple_t orderedCollection,size_t index,sysbvm_tuple_t value)

{
  _Bool _Var1;
  sysbvm_size_t sVar2;
  size_t size;
  sysbvm_orderedCollection_t *orderedCollectionObject;
  sysbvm_tuple_t value_local;
  size_t index_local;
  sysbvm_tuple_t orderedCollection_local;
  
  _Var1 = sysbvm_tuple_isNonNullPointer(orderedCollection);
  if (!_Var1) {
    sysbvm_error_nullArgument();
  }
  sVar2 = sysbvm_tuple_size_decode(*(sysbvm_tuple_t *)(orderedCollection + 0x10));
  if (sVar2 <= index) {
    sysbvm_error_indexOutOfBounds();
  }
  *(sysbvm_tuple_t *)(*(long *)(orderedCollection + 0x18) + 0x10 + index * 8) = value;
  return;
}

Assistant:

SYSBVM_API void sysbvm_orderedCollection_atPut(sysbvm_tuple_t orderedCollection, size_t index, sysbvm_tuple_t value)
{
    if(!sysbvm_tuple_isNonNullPointer(orderedCollection)) sysbvm_error_nullArgument();

    sysbvm_orderedCollection_t *orderedCollectionObject = (sysbvm_orderedCollection_t*)orderedCollection;
    size_t size = sysbvm_tuple_size_decode(orderedCollectionObject->size);
    if(index >= size)
        sysbvm_error_indexOutOfBounds();

    ((sysbvm_array_t*)orderedCollectionObject->storage)->elements[index] = value;
}